

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateExtraDefaultFields
          (MessageGenerator *this,Printer *printer)

{
  FieldDescriptor *this_00;
  Type TVar1;
  CType CVar2;
  FieldGenerator *pFVar3;
  Descriptor *pDVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  string local_50;
  
  if ((0 < *(int *)(this->descriptor_ + 0x38)) || (0 < this->num_weak_fields_)) {
    io::Printer::Print(printer,"public:\n");
    if (0 < *(int *)(this->descriptor_ + 0x38)) {
      lVar5 = 0;
      do {
        lVar8 = *(long *)(this->descriptor_ + 0x40);
        lVar6 = lVar5 * 0x30;
        if (0 < *(int *)(lVar8 + 0x1c + lVar6)) {
          lVar7 = 0;
          do {
            this_00 = *(FieldDescriptor **)(*(long *)(lVar8 + 0x20 + lVar6) + lVar7 * 8);
            TVar1 = FieldDescriptor::type(this_00);
            if ((*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar1 * 4) == 10) ||
               ((TVar1 = FieldDescriptor::type(this_00),
                *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar1 * 4) == 9 &&
                (CVar2 = EffectiveStringCType(this_00), CVar2 != FieldOptions_CType_STRING)))) {
              io::Printer::Print(printer,"const ");
            }
            pFVar3 = FieldGeneratorMap::get(&this->field_generators_,this_00);
            (*pFVar3->_vptr_FieldGenerator[2])(pFVar3,printer);
            lVar7 = lVar7 + 1;
            lVar8 = *(long *)(this->descriptor_ + 0x40);
          } while (lVar7 < *(int *)(lVar8 + 0x1c + lVar6));
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < *(int *)(this->descriptor_ + 0x38));
    }
    pDVar4 = this->descriptor_;
    if (0 < *(int *)(pDVar4 + 0x2c)) {
      lVar8 = 0;
      lVar5 = 0;
      do {
        if (*(char *)(*(long *)(*(long *)(pDVar4 + 0x30) + 0x80 + lVar8) + 0x6f) == '\x01') {
          FieldName_abi_cxx11_
                    (&local_50,(cpp *)(*(long *)(pDVar4 + 0x30) + lVar8),(FieldDescriptor *)this);
          io::Printer::Print(printer,"  const ::google::protobuf::Message* $name$_;\n","name",
                             &local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
        lVar5 = lVar5 + 1;
        pDVar4 = this->descriptor_;
        lVar8 = lVar8 + 0xa8;
      } while (lVar5 < *(int *)(pDVar4 + 0x2c));
    }
  }
  return;
}

Assistant:

void MessageGenerator::
GenerateExtraDefaultFields(io::Printer* printer) {
  // Generate oneof default instance and weak field instances for reflection
  // usage.
  if (descriptor_->oneof_decl_count() > 0 || num_weak_fields_ > 0) {
    printer->Print("public:\n");
    for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
      for (int j = 0; j < descriptor_->oneof_decl(i)->field_count(); j++) {
        const FieldDescriptor* field = descriptor_->oneof_decl(i)->field(j);
        if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE ||
            (field->cpp_type() == FieldDescriptor::CPPTYPE_STRING &&
             EffectiveStringCType(field) != FieldOptions::STRING)) {
          printer->Print("const ");
        }
        field_generators_.get(field).GeneratePrivateMembers(printer);
      }
    }
    for (int i = 0; i < descriptor_->field_count(); i++) {
      const FieldDescriptor* field = descriptor_->field(i);
      if (field->options().weak()) {
        printer->Print(
            "  const ::google::protobuf::Message* $name$_;\n", "name", FieldName(field));
      }
    }
  }
}